

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath __thiscall
testing::internal::FilePath::GenerateUniqueFileName
          (FilePath *this,FilePath *directory,FilePath *base_name,char *extension)

{
  int iVar1;
  char *pcVar2;
  size_t extraout_RDX;
  int number;
  FilePath FVar3;
  StatStruct file_stat;
  stat local_c0;
  
  pcVar2 = (char *)operator_new__(1);
  *pcVar2 = '\0';
  (this->pathname_).c_str_ = pcVar2;
  (this->pathname_).length_ = 0;
  number = 0;
  do {
    MakeFileName((FilePath *)&local_c0,directory,base_name,number,extension);
    String::operator=(&this->pathname_,(String *)&local_c0);
    if ((void *)local_c0.st_dev != (void *)0x0) {
      operator_delete__((void *)local_c0.st_dev);
    }
    iVar1 = stat((this->pathname_).c_str_,&local_c0);
    number = number + 1;
  } while (iVar1 == 0);
  FVar3.pathname_.length_ = extraout_RDX;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::GenerateUniqueFileName(const FilePath& directory,
                                          const FilePath& base_name,
                                          const char* extension) {
  FilePath full_pathname;
  int number = 0;
  do {
    full_pathname.Set(MakeFileName(directory, base_name, number++, extension));
  } while (full_pathname.FileOrDirectoryExists());
  return full_pathname;
}